

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c++
# Opt level: O1

String * __thiscall kj::Url::toString(String *__return_storage_ptr__,Url *this,Context context)

{
  anon_union_56_1_a8c68091_for_NullableValue<kj::Url::UserInfo>_2 *paVar1;
  byte *pbVar2;
  QueryParam *pQVar3;
  Fault FVar4;
  int iVar5;
  RemoveConst<char> *pRVar6;
  char *pcVar7;
  char *pcVar8;
  anon_union_24_1_a8c68091_for_NullableValue<kj::String>_2 *paVar9;
  String *extraout_RDX;
  String *pSVar10;
  String *extraout_RDX_00;
  String *extraout_RDX_01;
  String *extraout_RDX_02;
  String *extraout_RDX_03;
  String *extraout_RDX_04;
  kj *pkVar11;
  long lVar12;
  String *extraout_RDX_05;
  String *extraout_RDX_06;
  String *extraout_RDX_07;
  String *extraout_RDX_08;
  String *extraout_RDX_09;
  String *extraout_RDX_10;
  String *extraout_RDX_11;
  kj *pkVar13;
  String *extraout_RDX_12;
  String *extraout_RDX_13;
  String *extraout_RDX_14;
  String *extraout_RDX_15;
  String *extraout_RDX_16;
  kj *pkVar14;
  String *extraout_RDX_17;
  String *extraout_RDX_18;
  String *extraout_RDX_19;
  String *extraout_RDX_20;
  String *extraout_RDX_21;
  String *extraout_RDX_22;
  String *extraout_RDX_23;
  String *extraout_RDX_24;
  RemoveConst<char> RVar15;
  String *pSVar16;
  byte *__src;
  Exception *pEVar17;
  kj *pkVar18;
  long lVar19;
  String *pSVar20;
  size_t sVar21;
  RemoveConst<char> *pRVar22;
  char *pcVar23;
  ulong uVar24;
  size_t sVar25;
  byte *pbVar26;
  kj *pkVar27;
  QueryParam *pQVar28;
  bool bVar29;
  bool bVar30;
  ArrayPtr<const_unsigned_char> bytes;
  ArrayPtr<const_unsigned_char> bytes_00;
  ArrayPtr<const_unsigned_char> bytes_01;
  ArrayPtr<const_unsigned_char> bytes_02;
  ArrayPtr<const_unsigned_char> bytes_03;
  ArrayPtr<const_unsigned_char> bytes_04;
  bool _kjCondition;
  Vector<char> chars;
  Fault f;
  char *pcStack_60;
  ArrayDisposer *local_58;
  
  pcVar7 = pcStack_60;
  pcVar8 = (char *)0x0;
  chars.builder.ptr =
       (char *)kj::_::HeapArrayDisposer::allocateImpl
                         (1,0,0x80,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  chars.builder.endPtr = chars.builder.ptr + 0x80;
  chars.builder.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  pSVar10 = extraout_RDX;
  chars.builder.pos = chars.builder.ptr;
  if (context != HTTP_REQUEST) {
    pcVar23 = (this->scheme).content.ptr;
    sVar21 = (this->scheme).content.size_;
    pcVar8 = pcVar23 + (sVar21 - 1);
    if (sVar21 == 0) {
      pcVar8 = (char *)0x0;
      pcVar23 = (char *)0x0;
    }
    uVar24 = (long)pcVar8 - (long)pcVar23;
    if (0x80 < uVar24) {
      sVar21 = 0x100;
      if (0x100 < uVar24) {
        sVar21 = uVar24;
      }
      Vector<char>::setCapacity(&chars,sVar21);
    }
    pRVar6 = chars.builder.pos;
    if (pcVar23 != pcVar8) {
      memcpy(chars.builder.pos,pcVar23,uVar24);
      chars.builder.pos = pRVar6 + uVar24;
    }
    pSVar16 = (String *)(chars.builder.pos + (3 - (long)chars.builder.ptr));
    pSVar10 = (String *)(chars.builder.endPtr + -(long)chars.builder.ptr);
    if (pSVar10 < pSVar16) {
      pSVar20 = (String *)&DAT_00000004;
      if (chars.builder.endPtr != chars.builder.ptr) {
        pSVar20 = (String *)((long)pSVar10 * 2);
      }
      if (pSVar20 < pSVar16) {
        pSVar20 = pSVar16;
      }
      Vector<char>::setCapacity(&chars,(size_t)pSVar20);
      pSVar10 = extraout_RDX_00;
    }
    chars.builder.pos[2] = '/';
    chars.builder.pos[0] = ':';
    chars.builder.pos[1] = '/';
    chars.builder.pos = chars.builder.pos + 3;
    if (context == REMOTE_HREF) {
      bVar29 = (this->userInfo).ptr.isSet;
      paVar1 = &(this->userInfo).ptr.field_1;
      pkVar27 = (kj *)0x0;
      if (bVar29 != false) {
        pkVar27 = (kj *)paVar1;
      }
      if (bVar29 == true) {
        if ((this->options).percentDecode == true) {
          pkVar11 = *(kj **)(pkVar27 + 8);
          pkVar18 = pkVar11;
          if (pkVar11 != (kj *)0x0) {
            pkVar18 = *(kj **)pkVar27;
          }
          pkVar14 = (kj *)0x0;
          if (pkVar11 != (kj *)0x0) {
            pkVar14 = pkVar11 + -1;
          }
          bytes.size_ = (size_t)paVar1;
          bytes.ptr = (uchar *)pkVar14;
          encodeUriUserInfo((String *)&f,pkVar18,bytes);
        }
        else {
          str<kj::String_const&>((String *)&f,pkVar27,pSVar10);
        }
        pEVar17 = (Exception *)
                  ((undefined1 *)((long)&f.exception[-1].details.builder.disposer + 7) +
                  (long)pcStack_60);
        FVar4.exception = f.exception;
        if (pcStack_60 == (char *)0x0) {
          pEVar17 = (Exception *)0x0;
          FVar4.exception = (Exception *)0x0;
        }
        sVar25 = (long)pEVar17 - (long)FVar4.exception;
        pSVar16 = (String *)(chars.builder.pos + (sVar25 - (long)chars.builder.ptr));
        pSVar10 = (String *)(chars.builder.endPtr + -(long)chars.builder.ptr);
        pcVar8 = chars.builder.ptr;
        if (pSVar10 < pSVar16) {
          pSVar20 = (String *)&DAT_00000004;
          if (chars.builder.endPtr != chars.builder.ptr) {
            pSVar20 = (String *)((long)pSVar10 * 2);
          }
          if (pSVar20 < pSVar16) {
            pSVar20 = pSVar16;
          }
          Vector<char>::setCapacity(&chars,(size_t)pSVar20);
          pSVar10 = extraout_RDX_01;
        }
        pRVar6 = chars.builder.pos;
        if (FVar4.exception != pEVar17) {
          memcpy(chars.builder.pos,FVar4.exception,sVar25);
          chars.builder.pos = pRVar6 + sVar25;
          pSVar10 = extraout_RDX_02;
        }
        FVar4.exception = f.exception;
        if (f.exception != (Exception *)0x0) {
          f.exception = (Exception *)0x0;
          pcStack_60 = (char *)0x0;
          (**local_58->_vptr_ArrayDisposer)(local_58,FVar4.exception,1,pcVar7,pcVar7,0);
          pcVar8 = pcVar7;
          pSVar10 = extraout_RDX_03;
        }
        pcVar7 = pcStack_60;
        pkVar11 = (kj *)0x0;
        if (pkVar27[0x18] != (kj)0x0) {
          pkVar11 = pkVar27 + 0x20;
        }
        if (pkVar27[0x18] == (kj)0x1) {
          if (chars.builder.pos == chars.builder.endPtr) {
            sVar21 = 4;
            if (chars.builder.endPtr != chars.builder.ptr) {
              sVar21 = ((long)chars.builder.endPtr - (long)chars.builder.ptr) * 2;
            }
            pcVar8 = chars.builder.ptr;
            Vector<char>::setCapacity(&chars,sVar21);
            pSVar10 = extraout_RDX_04;
          }
          *chars.builder.pos = ':';
          chars.builder.pos = chars.builder.pos + 1;
          if ((this->options).percentDecode == true) {
            pkVar27 = *(kj **)(pkVar11 + 8);
            pkVar18 = pkVar27;
            if (pkVar27 != (kj *)0x0) {
              pkVar18 = *(kj **)pkVar11;
            }
            pkVar11 = (kj *)0x0;
            if (pkVar27 != (kj *)0x0) {
              pkVar11 = pkVar27 + -1;
            }
            bytes_00.size_ = (size_t)pcVar8;
            bytes_00.ptr = (uchar *)pkVar11;
            encodeUriUserInfo((String *)&f,pkVar18,bytes_00);
          }
          else {
            str<kj::String_const&>((String *)&f,pkVar11,pSVar10);
          }
          pEVar17 = (Exception *)
                    ((undefined1 *)((long)&f.exception[-1].details.builder.disposer + 7) +
                    (long)pcStack_60);
          FVar4.exception = f.exception;
          if (pcStack_60 == (char *)0x0) {
            pEVar17 = (Exception *)0x0;
            FVar4.exception = (Exception *)0x0;
          }
          sVar25 = (long)pEVar17 - (long)FVar4.exception;
          pRVar6 = chars.builder.pos + (sVar25 - (long)chars.builder.ptr);
          if (chars.builder.endPtr + -(long)chars.builder.ptr < pRVar6) {
            pRVar22 = (RemoveConst<char> *)0x4;
            if (chars.builder.endPtr != chars.builder.ptr) {
              pRVar22 = (RemoveConst<char> *)
                        ((long)(chars.builder.endPtr + -(long)chars.builder.ptr) * 2);
            }
            if (pRVar22 < pRVar6) {
              pRVar22 = pRVar6;
            }
            Vector<char>::setCapacity(&chars,(size_t)pRVar22);
          }
          pRVar6 = chars.builder.pos;
          if (FVar4.exception != pEVar17) {
            memcpy(chars.builder.pos,FVar4.exception,sVar25);
            chars.builder.pos = pRVar6 + sVar25;
          }
          FVar4.exception = f.exception;
          if (f.exception != (Exception *)0x0) {
            f.exception = (Exception *)0x0;
            pcStack_60 = (char *)0x0;
            (**local_58->_vptr_ArrayDisposer)(local_58,FVar4.exception,1,pcVar7,pcVar7,0);
          }
        }
        if (chars.builder.pos == chars.builder.endPtr) {
          sVar21 = 4;
          if (chars.builder.endPtr != chars.builder.ptr) {
            sVar21 = ((long)chars.builder.endPtr - (long)chars.builder.ptr) * 2;
          }
          Vector<char>::setCapacity(&chars,sVar21);
        }
        *chars.builder.pos = '@';
        chars.builder.pos = chars.builder.pos + 1;
      }
    }
    pbVar26 = (byte *)(this->host).content.ptr;
    sVar21 = (this->host).content.size_;
    __src = pbVar26;
    if (sVar21 == 0) {
      __src = (byte *)0x0;
    }
    bVar29 = sVar21 == 0;
    lVar19 = sVar21 - 1;
    lVar12 = 0;
    if (!bVar29) {
      lVar12 = lVar19;
    }
    bVar30 = bVar29 || lVar19 == 0;
    if ((!bVar29 && lVar19 != 0) &&
       ((*(ulong *)((anonymous_namespace)::HOST_CHARS + (ulong)(*__src >> 6) * 8) >>
         ((ulong)*__src & 0x3f) & 1) != 0)) {
      lVar19 = 1;
      do {
        bVar30 = lVar12 == lVar19;
        if (bVar30) break;
        pbVar2 = __src + lVar19;
        lVar19 = lVar19 + 1;
      } while ((*(ulong *)((anonymous_namespace)::HOST_CHARS + (ulong)(*pbVar2 >> 6) * 8) >>
                ((ulong)*pbVar2 & 0x3f) & 1) != 0);
    }
    if (bVar30) {
      pbVar26 = pbVar26 + (sVar21 - 1);
      if (sVar21 == 0) {
        pbVar26 = (byte *)0x0;
      }
      sVar25 = (long)pbVar26 - (long)__src;
      pSVar16 = (String *)(chars.builder.pos + (sVar25 - (long)chars.builder.ptr));
      pSVar10 = (String *)(chars.builder.endPtr + -(long)chars.builder.ptr);
      pcVar8 = chars.builder.ptr;
      if (pSVar10 < pSVar16) {
        pSVar20 = (String *)&DAT_00000004;
        if (chars.builder.endPtr != chars.builder.ptr) {
          pSVar20 = (String *)((long)pSVar10 * 2);
        }
        if (pSVar20 < pSVar16) {
          pSVar20 = pSVar16;
        }
        Vector<char>::setCapacity(&chars,(size_t)pSVar20);
        pSVar10 = extraout_RDX_05;
      }
      pRVar6 = chars.builder.pos;
      if (__src != pbVar26) {
        memcpy(chars.builder.pos,__src,sVar25);
        chars.builder.pos = pRVar6 + sVar25;
        pSVar10 = extraout_RDX_06;
      }
    }
    else {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[39],kj::String_const&>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/url.c++"
                 ,0x1c5,FAILED,(char *)0x0,"\"invalid hostname when stringifying URL\", host",
                 (char (*) [39])"invalid hostname when stringifying URL",&this->host);
      pRVar6 = chars.builder.pos + (0xc - (long)chars.builder.ptr);
      if (chars.builder.endPtr + -(long)chars.builder.ptr < pRVar6) {
        pRVar22 = (RemoveConst<char> *)0x4;
        if (chars.builder.endPtr != chars.builder.ptr) {
          pRVar22 = (RemoveConst<char> *)
                    ((long)(chars.builder.endPtr + -(long)chars.builder.ptr) * 2);
        }
        if (pRVar22 < pRVar6) {
          pRVar22 = pRVar6;
        }
        Vector<char>::setCapacity(&chars,(size_t)pRVar22);
      }
      pcVar8 = (char *)0x2d64696c61766e69;
      builtin_memcpy(chars.builder.pos,"invalid-host",0xc);
      chars.builder.pos = chars.builder.pos + 0xc;
      kj::_::Debug::Fault::~Fault(&f);
      pSVar10 = extraout_RDX_07;
    }
  }
  pkVar27 = (kj *)(this->path).builder.ptr;
  pkVar11 = (kj *)(this->path).builder.pos;
  if (pkVar27 != pkVar11) {
    do {
      pcVar7 = pcStack_60;
      uVar24 = *(ulong *)(pkVar27 + 8);
      sVar25 = uVar24 + (uVar24 == 0);
      bVar29 = true;
      if (uVar24 < 2) {
        pcVar23 = "";
        if (uVar24 != 0) {
          pcVar23 = *(char **)pkVar27;
        }
        iVar5 = bcmp(pcVar23,"",sVar25);
        bVar29 = iVar5 != 0;
        pSVar10 = extraout_RDX_08;
      }
      if ((!bVar29) && (((this->options).allowEmpty & 1U) == 0)) {
LAB_00399a5c:
        _kjCondition = false;
LAB_00399a61:
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,bool&,char_const(&)[25],kj::Vector<kj::String>const&>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/url.c++"
                   ,0x1cf,FAILED,
                   "(pathPart != \"\" || options.allowEmpty) && pathPart != \".\" && pathPart != \"..\""
                   ,"_kjCondition,\"invalid name in URL path\", path",&_kjCondition,
                   (char (*) [25])"invalid name in URL path",&this->path);
        kj::_::Debug::Fault::fatal(&f);
      }
      if (uVar24 == 3) {
        iVar5 = bcmp(*(void **)pkVar27,"..",sVar25);
        _kjCondition = iVar5 != 0;
        pSVar10 = extraout_RDX_10;
        if (!_kjCondition) goto LAB_00399a61;
      }
      else {
        if ((uVar24 == 2) &&
           (iVar5 = bcmp(*(void **)pkVar27,".",sVar25), pSVar10 = extraout_RDX_09, iVar5 == 0))
        goto LAB_00399a5c;
        _kjCondition = true;
      }
      if (chars.builder.pos == chars.builder.endPtr) {
        sVar21 = ((long)chars.builder.endPtr - (long)chars.builder.ptr) * 2;
        if (chars.builder.endPtr == chars.builder.ptr) {
          sVar21 = 4;
        }
        pcVar8 = chars.builder.ptr;
        Vector<char>::setCapacity(&chars,sVar21);
        pSVar10 = extraout_RDX_11;
      }
      *chars.builder.pos = '/';
      chars.builder.pos = chars.builder.pos + 1;
      if ((this->options).percentDecode == true) {
        pkVar18 = *(kj **)(pkVar27 + 8);
        pkVar14 = pkVar18;
        if (pkVar18 != (kj *)0x0) {
          pkVar14 = *(kj **)pkVar27;
        }
        pkVar13 = pkVar18 + -1;
        if (pkVar18 == (kj *)0x0) {
          pkVar13 = (kj *)0x0;
        }
        bytes_01.size_ = (size_t)pcVar8;
        bytes_01.ptr = (uchar *)pkVar13;
        encodeUriPath((String *)&f,pkVar14,bytes_01);
      }
      else {
        str<kj::String_const&>((String *)&f,pkVar27,pSVar10);
      }
      pEVar17 = (Exception *)
                ((undefined1 *)((long)&f.exception[-1].details.builder.disposer + 7) +
                (long)pcStack_60);
      FVar4.exception = f.exception;
      if (pcStack_60 == (char *)0x0) {
        pEVar17 = (Exception *)0x0;
        FVar4.exception = (Exception *)0x0;
      }
      sVar25 = (long)pEVar17 - (long)FVar4.exception;
      pRVar6 = chars.builder.pos + (sVar25 - (long)chars.builder.ptr);
      pcVar8 = chars.builder.ptr;
      pSVar10 = (String *)chars.builder.endPtr;
      if (chars.builder.endPtr + -(long)chars.builder.ptr < pRVar6) {
        pRVar22 = (RemoveConst<char> *)((long)(chars.builder.endPtr + -(long)chars.builder.ptr) * 2)
        ;
        pcVar8 = &DAT_00000004;
        if (chars.builder.endPtr == chars.builder.ptr) {
          pRVar22 = (RemoveConst<char> *)0x4;
        }
        if (pRVar22 < pRVar6) {
          pRVar22 = pRVar6;
        }
        Vector<char>::setCapacity(&chars,(size_t)pRVar22);
        pSVar10 = extraout_RDX_12;
      }
      pRVar6 = chars.builder.pos;
      if (FVar4.exception != pEVar17) {
        memcpy(chars.builder.pos,FVar4.exception,sVar25);
        chars.builder.pos = pRVar6 + sVar25;
        pSVar10 = extraout_RDX_13;
      }
      FVar4.exception = f.exception;
      if (f.exception != (Exception *)0x0) {
        f.exception = (Exception *)0x0;
        pcStack_60 = (char *)0x0;
        (**local_58->_vptr_ArrayDisposer)(local_58,FVar4.exception,1,pcVar7,pcVar7,0);
        pcVar8 = pcVar7;
        pSVar10 = extraout_RDX_14;
      }
      pkVar27 = pkVar27 + 0x18;
    } while (pkVar27 != pkVar11);
  }
  if ((this->hasTrailingSlash != false) ||
     ((context == HTTP_REQUEST && ((this->path).builder.pos == (this->path).builder.ptr)))) {
    if (chars.builder.pos == chars.builder.endPtr) {
      sVar21 = 4;
      if (chars.builder.endPtr != chars.builder.ptr) {
        sVar21 = ((long)chars.builder.endPtr - (long)chars.builder.ptr) * 2;
      }
      pcVar8 = chars.builder.ptr;
      Vector<char>::setCapacity(&chars,sVar21);
      pSVar10 = extraout_RDX_15;
    }
    *chars.builder.pos = '/';
    chars.builder.pos = chars.builder.pos + 1;
  }
  pQVar28 = (this->query).builder.ptr;
  pQVar3 = (this->query).builder.pos;
  if (pQVar28 != pQVar3) {
    RVar15 = '?';
    pkVar27 = (kj *)&pQVar28->value;
    do {
      pcVar7 = pcStack_60;
      if (chars.builder.pos == chars.builder.endPtr) {
        sVar21 = ((long)chars.builder.endPtr - (long)chars.builder.ptr) * 2;
        if (chars.builder.endPtr == chars.builder.ptr) {
          sVar21 = 4;
        }
        pcVar8 = chars.builder.ptr;
        Vector<char>::setCapacity(&chars,sVar21);
        pSVar10 = extraout_RDX_16;
      }
      *chars.builder.pos = RVar15;
      chars.builder.pos = chars.builder.pos + 1;
      if ((this->options).percentDecode == true) {
        pkVar11 = *(kj **)(pkVar27 + -0x10);
        pkVar18 = pkVar11;
        if (pkVar11 != (kj *)0x0) {
          pkVar18 = *(kj **)(pkVar27 + -0x18);
        }
        pkVar14 = pkVar11 + -1;
        if (pkVar11 == (kj *)0x0) {
          pkVar14 = (kj *)0x0;
        }
        bytes_02.size_ = (size_t)pcVar8;
        bytes_02.ptr = (uchar *)pkVar14;
        encodeWwwForm((String *)&f,pkVar18,bytes_02);
      }
      else {
        str<kj::String_const&>((String *)&f,pkVar27 + -0x18,pSVar10);
      }
      pEVar17 = (Exception *)
                ((undefined1 *)((long)&f.exception[-1].details.builder.disposer + 7) +
                (long)pcStack_60);
      FVar4.exception = f.exception;
      if (pcStack_60 == (char *)0x0) {
        pEVar17 = (Exception *)0x0;
        FVar4.exception = (Exception *)0x0;
      }
      sVar25 = (long)pEVar17 - (long)FVar4.exception;
      pRVar6 = chars.builder.pos + (sVar25 - (long)chars.builder.ptr);
      pcVar8 = chars.builder.ptr;
      pSVar10 = (String *)chars.builder.endPtr;
      if (chars.builder.endPtr + -(long)chars.builder.ptr < pRVar6) {
        pRVar22 = (RemoveConst<char> *)((long)(chars.builder.endPtr + -(long)chars.builder.ptr) * 2)
        ;
        pcVar8 = &DAT_00000004;
        if (chars.builder.endPtr == chars.builder.ptr) {
          pRVar22 = (RemoveConst<char> *)0x4;
        }
        if (pRVar22 < pRVar6) {
          pRVar22 = pRVar6;
        }
        Vector<char>::setCapacity(&chars,(size_t)pRVar22);
        pSVar10 = extraout_RDX_17;
      }
      pRVar6 = chars.builder.pos;
      if (FVar4.exception != pEVar17) {
        memcpy(chars.builder.pos,FVar4.exception,sVar25);
        chars.builder.pos = pRVar6 + sVar25;
        pSVar10 = extraout_RDX_18;
      }
      FVar4.exception = f.exception;
      if (f.exception != (Exception *)0x0) {
        f.exception = (Exception *)0x0;
        pcStack_60 = (char *)0x0;
        (**local_58->_vptr_ArrayDisposer)(local_58,FVar4.exception,1,pcVar7,pcVar7,0);
        pcVar8 = pcVar7;
        pSVar10 = extraout_RDX_19;
      }
      pcVar7 = pcStack_60;
      if ((*(long *)(pkVar27 + 8) != 0) && (*(long *)pkVar27 != 0)) {
        if (chars.builder.pos == chars.builder.endPtr) {
          sVar21 = ((long)chars.builder.endPtr - (long)chars.builder.ptr) * 2;
          if (chars.builder.endPtr == chars.builder.ptr) {
            sVar21 = 4;
          }
          pcVar8 = chars.builder.ptr;
          Vector<char>::setCapacity(&chars,sVar21);
          pSVar10 = extraout_RDX_20;
        }
        *chars.builder.pos = '=';
        chars.builder.pos = chars.builder.pos + 1;
        if ((this->options).percentDecode == true) {
          pkVar11 = *(kj **)(pkVar27 + 8);
          pkVar18 = pkVar11;
          if (pkVar11 != (kj *)0x0) {
            pkVar18 = *(kj **)pkVar27;
          }
          pkVar14 = (kj *)0x0;
          if (pkVar11 != (kj *)0x0) {
            pkVar14 = pkVar11 + -1;
          }
          bytes_03.size_ = (size_t)pcVar8;
          bytes_03.ptr = (uchar *)pkVar14;
          encodeWwwForm((String *)&f,pkVar18,bytes_03);
        }
        else {
          str<kj::String_const&>((String *)&f,pkVar27,pSVar10);
        }
        pEVar17 = (Exception *)
                  ((undefined1 *)((long)&f.exception[-1].details.builder.disposer + 7) +
                  (long)pcStack_60);
        FVar4.exception = f.exception;
        if (pcStack_60 == (char *)0x0) {
          pEVar17 = (Exception *)0x0;
          FVar4.exception = (Exception *)0x0;
        }
        sVar25 = (long)pEVar17 - (long)FVar4.exception;
        pRVar6 = chars.builder.pos + (sVar25 - (long)chars.builder.ptr);
        pcVar8 = chars.builder.ptr;
        pSVar10 = (String *)chars.builder.endPtr;
        if (chars.builder.endPtr + -(long)chars.builder.ptr < pRVar6) {
          pRVar22 = (RemoveConst<char> *)
                    ((long)(chars.builder.endPtr + -(long)chars.builder.ptr) * 2);
          pcVar8 = &DAT_00000004;
          if (chars.builder.endPtr == chars.builder.ptr) {
            pRVar22 = (RemoveConst<char> *)0x4;
          }
          if (pRVar22 < pRVar6) {
            pRVar22 = pRVar6;
          }
          Vector<char>::setCapacity(&chars,(size_t)pRVar22);
          pSVar10 = extraout_RDX_21;
        }
        pRVar6 = chars.builder.pos;
        if (FVar4.exception != pEVar17) {
          memcpy(chars.builder.pos,FVar4.exception,sVar25);
          chars.builder.pos = pRVar6 + sVar25;
          pSVar10 = extraout_RDX_22;
        }
        FVar4.exception = f.exception;
        if (f.exception != (Exception *)0x0) {
          f.exception = (Exception *)0x0;
          pcStack_60 = (char *)0x0;
          (**local_58->_vptr_ArrayDisposer)(local_58,FVar4.exception,1,pcVar7,pcVar7);
          pcVar8 = pcVar7;
          pSVar10 = extraout_RDX_23;
        }
      }
      pQVar28 = (QueryParam *)(pkVar27 + 0x18);
      RVar15 = '&';
      pkVar27 = pkVar27 + 0x30;
    } while (pQVar28 != pQVar3);
  }
  if (context == REMOTE_HREF) {
    bVar29 = (this->fragment).ptr.isSet;
    paVar9 = &(this->fragment).ptr.field_1;
    pkVar27 = (kj *)0x0;
    if (bVar29 != false) {
      pkVar27 = (kj *)paVar9;
    }
    if (bVar29 == true) {
      if (chars.builder.pos == chars.builder.endPtr) {
        sVar21 = 4;
        if (chars.builder.endPtr != chars.builder.ptr) {
          sVar21 = ((long)chars.builder.endPtr - (long)chars.builder.ptr) * 2;
        }
        paVar9 = (anon_union_24_1_a8c68091_for_NullableValue<kj::String>_2 *)chars.builder.ptr;
        Vector<char>::setCapacity(&chars,sVar21);
        pSVar10 = extraout_RDX_24;
      }
      *chars.builder.pos = '#';
      chars.builder.pos = chars.builder.pos + 1;
      if ((this->options).percentDecode == true) {
        pkVar11 = *(kj **)(pkVar27 + 8);
        pkVar18 = pkVar11;
        if (pkVar11 != (kj *)0x0) {
          pkVar18 = *(kj **)pkVar27;
        }
        pkVar27 = (kj *)0x0;
        if (pkVar11 != (kj *)0x0) {
          pkVar27 = pkVar11 + -1;
        }
        bytes_04.size_ = (size_t)paVar9;
        bytes_04.ptr = (uchar *)pkVar27;
        encodeUriFragment((String *)&f,pkVar18,bytes_04);
      }
      else {
        str<kj::String_const&>((String *)&f,pkVar27,pSVar10);
      }
      pEVar17 = (Exception *)
                ((undefined1 *)((long)&f.exception[-1].details.builder.disposer + 7) +
                (long)pcStack_60);
      FVar4.exception = f.exception;
      if (pcStack_60 == (char *)0x0) {
        pEVar17 = (Exception *)0x0;
        FVar4.exception = (Exception *)0x0;
      }
      sVar25 = (long)pEVar17 - (long)FVar4.exception;
      pRVar6 = chars.builder.pos + (sVar25 - (long)chars.builder.ptr);
      if (chars.builder.endPtr + -(long)chars.builder.ptr < pRVar6) {
        pRVar22 = (RemoveConst<char> *)0x4;
        if (chars.builder.endPtr != chars.builder.ptr) {
          pRVar22 = (RemoveConst<char> *)
                    ((long)(chars.builder.endPtr + -(long)chars.builder.ptr) * 2);
        }
        if (pRVar22 < pRVar6) {
          pRVar22 = pRVar6;
        }
        Vector<char>::setCapacity(&chars,(size_t)pRVar22);
      }
      pRVar6 = chars.builder.pos;
      if (FVar4.exception != pEVar17) {
        memcpy(chars.builder.pos,FVar4.exception,sVar25);
        chars.builder.pos = pRVar6 + sVar25;
      }
      FVar4.exception = f.exception;
      if (f.exception != (Exception *)0x0) {
        f.exception = (Exception *)0x0;
        (**local_58->_vptr_ArrayDisposer)(local_58,FVar4.exception,1,pcStack_60,pcStack_60,0);
      }
    }
  }
  if (chars.builder.pos == chars.builder.endPtr) {
    sVar21 = 4;
    if (chars.builder.endPtr != chars.builder.ptr) {
      sVar21 = ((long)chars.builder.endPtr - (long)chars.builder.ptr) * 2;
    }
    Vector<char>::setCapacity(&chars,sVar21);
  }
  *chars.builder.pos = '\0';
  chars.builder.pos = chars.builder.pos + 1;
  if (chars.builder.pos != chars.builder.endPtr) {
    Vector<char>::setCapacity(&chars,(long)chars.builder.pos - (long)chars.builder.ptr);
  }
  (__return_storage_ptr__->content).ptr = chars.builder.ptr;
  (__return_storage_ptr__->content).size_ = (long)chars.builder.pos - (long)chars.builder.ptr;
  (__return_storage_ptr__->content).disposer = chars.builder.disposer;
  return __return_storage_ptr__;
}

Assistant:

String Url::toString(Context context) const {
  Vector<char> chars(128);

  if (context != HTTP_REQUEST) {
    chars.addAll(scheme);
    chars.addAll("://"_kj);

    if (context == REMOTE_HREF) {
      KJ_IF_SOME(user, userInfo) {
        chars.addAll(options.percentDecode ? encodeUriUserInfo(user.username)
                                          : kj::str(user.username));
        KJ_IF_SOME(pass, user.password) {
          chars.add(':');
          chars.addAll(options.percentDecode ? encodeUriUserInfo(pass) : kj::str(pass));
        }
        chars.add('@');
      }
    }

    // RFC3986 specifies that hosts can contain percent-encoding escapes while suggesting that
    // they should only be used for UTF-8 sequences. However, the DNS standard specifies a
    // different way to encode Unicode into domain names and doesn't permit any characters which
    // would need to be escaped. Meanwhile, encodeUriComponent() here would incorrectly try to
    // escape colons and brackets (e.g. around ipv6 literal addresses). So, instead, we throw if
    // the host is invalid.
    if (HOST_CHARS.containsAll(host)) {
      chars.addAll(host);
    } else {
      KJ_FAIL_REQUIRE("invalid hostname when stringifying URL", host) {
        chars.addAll("invalid-host"_kj);
        break;
      }
    }
  }

  for (auto& pathPart: path) {
    // Protect against path injection.
    KJ_REQUIRE((pathPart != "" || options.allowEmpty) && pathPart != "." && pathPart != "..",
               "invalid name in URL path", path) {
      continue;
    }
    chars.add('/');
    chars.addAll(options.percentDecode ? encodeUriPath(pathPart) : kj::str(pathPart));
  }
  if (hasTrailingSlash || (path.size() == 0 && context == HTTP_REQUEST)) {
    chars.add('/');
  }

  bool first = true;
  for (auto& param: query) {
    chars.add(first ? '?' : '&');
    first = false;
    chars.addAll(options.percentDecode ? encodeWwwForm(param.name) : kj::str(param.name));
    if (param.value.begin() != nullptr) {
      chars.add('=');
      chars.addAll(options.percentDecode ? encodeWwwForm(param.value) : kj::str(param.value));
    }
  }

  if (context == REMOTE_HREF) {
    KJ_IF_SOME(f, fragment) {
      chars.add('#');
      chars.addAll(options.percentDecode ? encodeUriFragment(f) : kj::str(f));
    }
  }

  chars.add('\0');
  return String(chars.releaseAsArray());
}